

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O2

void __thiscall
SuffixTree::GeneralizedSuffixTree::DumpNode(GeneralizedSuffixTree *this,Node *node,FILE *file)

{
  __node_base *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string label;
  
  fprintf((FILE *)file,"p%p [shape=circle label=\"%u; %u\"]\n",node,(ulong)node->num_leaves,
          (ulong)node->num_lca);
  p_Var1 = &(node->edges)._M_h._M_before_begin;
  label.field_2._8_8_ = node;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    if (*(int *)(p_Var1 + 4) == 0) {
      std::__cxx11::string::substr
                ((ulong)&local_78,
                 (ulong)((this->strings).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (uint)*(size_t *)(p_Var1 + 3)))
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     &local_78,"$");
      std::__cxx11::string::~string((string *)&local_78);
      fprintf((FILE *)file,"p%p -> p%p [label=\"%s\"]\n",label.field_2._8_8_,
              *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor,
              local_58);
      fprintf((FILE *)file,"p%p [style=filled color=grey shape=circle label=\"%u\"]\n",
              *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor,
              (ulong)*(uint *)&(*(_Hash_node_base **)
                                 &((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor)[1].
                               _M_nxt);
    }
    else {
      std::__cxx11::string::substr
                ((ulong)local_58,
                 (ulong)((this->strings).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (uint)*(size_t *)(p_Var1 + 3)))
      ;
      fprintf((FILE *)file,"p%p -> p%p [label=\"%s\"]\n",label.field_2._8_8_,
              *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor,
              local_58);
      DumpNode(this,*(Node **)&((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor,file);
    }
    std::__cxx11::string::~string((string *)local_58);
  }
  return;
}

Assistant:

void GeneralizedSuffixTree::DumpNode (Node *node, FILE *file)
{
    // dump style of current node
    fprintf (file, "p%p [shape=circle label=\"%u; %u\"]\n",
             static_cast<void *> (node), node->num_leaves, node->num_lca);
    // process all child of current node
    for (const auto &edge_pair : node->edges)
    {
        const Edge &edge = edge_pair.second;
        if (edge.length)
        {
            // child is node
            std::string label = strings[edge.string_number].substr (edge.start, edge.length);
            fprintf (file, "p%p -> p%p [label=\"%s\"]\n",
                     static_cast<void *> (node), static_cast<void *> (edge.node), label.c_str());
            DumpNode (edge.node, file);
        }
        else
        {
            // child is leaf
            std::string label = strings[edge.string_number].substr (edge.start) + "$";
            fprintf (file, "p%p -> p%p [label=\"%s\"]\n",
                     static_cast<void *> (node), static_cast<void *> (edge.leaf), label.c_str());
            fprintf (file, "p%p [style=filled color=grey shape=circle label=\"%u\"]\n",
                     static_cast<void *> (edge.leaf), edge.leaf->string_number);
        }
    }
}